

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O2

bool __thiscall cinatra::uri_t::parse_from(uri_t *this,char *encoded)

{
  char cVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  byte *pbVar7;
  char *uinfo_begin;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  long lVar12;
  char *path_begin;
  byte *pbVar13;
  size_t sVar14;
  byte *pbVar15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  
  pcVar6 = encoded;
  while( true ) {
    cVar1 = *pcVar6;
    if ((cVar1 == '\0') || (cVar1 == '/')) goto LAB_0011a483;
    if (cVar1 == ':') break;
    pcVar6 = pcVar6 + 1;
  }
  iVar5 = isalpha((int)*encoded);
  if (iVar5 == 0) {
    return false;
  }
  sVar14 = 1;
  pbVar10 = (byte *)(encoded + 2);
  while ((char)pbVar10[-1] != 0x3a) {
    bVar2 = is_scheme_character(this,(int)(char)pbVar10[-1]);
    pbVar10 = pbVar10 + 1;
    sVar14 = sVar14 + 1;
    if (!bVar2) {
      return false;
    }
  }
  (this->schema)._M_len = sVar14;
  (this->schema)._M_str = encoded;
  __y._M_str = "https";
  __y._M_len = 5;
  __x_00._M_str = encoded;
  __x_00._M_len = sVar14;
  bVar2 = std::operator==(__x_00,__y);
  bVar4 = true;
  if (!bVar2) {
    __x._M_len = (this->schema)._M_len;
    __x._M_str = (this->schema)._M_str;
    __y_00._M_str = "wss";
    __y_00._M_len = 3;
    bVar4 = std::operator==(__x,__y_00);
  }
  this->is_ssl = bVar4;
  encoded = (char *)pbVar10;
LAB_0011a483:
  if ((this->schema)._M_len == 0) {
    return false;
  }
  bVar3 = *encoded;
  if (bVar3 == 0x2f) {
    if (((byte *)encoded)[1] == 0x2f) {
      pbVar10 = (byte *)encoded + 2;
      lVar12 = 0;
      lVar8 = 0;
      while( true ) {
        bVar3 = pbVar10[lVar12];
        if (((ulong)bVar3 < 0x40) && ((0x8000800800000001U >> ((ulong)bVar3 & 0x3f) & 1) != 0))
        break;
        bVar2 = is_authority_character(this,(int)(char)bVar3);
        if (!bVar2) {
          return false;
        }
        lVar8 = lVar8 + -1;
        lVar12 = lVar12 + 1;
      }
      pbVar13 = pbVar10 + -lVar8;
      if (lVar8 != 0) {
        pbVar11 = (byte *)encoded + (3 - lVar8);
        sVar14 = 0xffffffffffffffff;
        do {
          pbVar7 = pbVar11 + -2;
          sVar14 = sVar14 + 1;
          pbVar11 = pbVar11 + -1;
          lVar9 = lVar8 + 1;
          if (lVar8 == -1) break;
          lVar8 = lVar9;
        } while ((int)(char)*pbVar7 - 0x30U < 10);
        pbVar15 = pbVar13;
        if (*pbVar7 == 0x3a) {
          pbVar15 = pbVar10 + -lVar9;
          (this->port)._M_len = sVar14;
          (this->port)._M_str = (char *)pbVar11;
        }
        lVar8 = 1;
        pbVar11 = pbVar10;
        do {
          pbVar7 = pbVar11;
          bVar2 = is_user_info_character(this,(int)(char)*pbVar7);
          lVar8 = lVar8 + -1;
          if (pbVar7 == pbVar15) break;
          pbVar11 = pbVar7 + 1;
        } while (bVar2);
        pbVar11 = pbVar10;
        if (*pbVar7 == 0x40) {
          (this->uinfo)._M_len = -lVar8;
          (this->uinfo)._M_str = (char *)pbVar10;
          pbVar11 = pbVar7 + 1;
        }
        (this->host)._M_len = (long)pbVar15 - (long)pbVar11;
        (this->host)._M_str = (char *)pbVar11;
        bVar3 = pbVar10[lVar12];
      }
      encoded = (char *)pbVar13;
      if (bVar3 != 0x2f) goto LAB_0011a531;
    }
  }
  else {
LAB_0011a531:
    bVar2 = is_path_character(this,(int)(char)bVar3);
    if (!bVar2) goto LAB_0011a67c;
  }
  sVar14 = 0;
  while( true ) {
    bVar3 = ((byte *)encoded)[sVar14];
    if (((ulong)bVar3 < 0x40) && ((0x8000000800000001U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) break;
    bVar2 = is_path_character(this,(int)(char)bVar3);
    if (!bVar2) {
      return false;
    }
    sVar14 = sVar14 + 1;
  }
  (this->path)._M_len = sVar14;
  (this->path)._M_str = encoded;
  encoded = (char *)((byte *)encoded + sVar14);
LAB_0011a67c:
  bVar3 = *encoded;
  if (bVar3 == 0x3f) {
    pbVar10 = (byte *)encoded + 1;
    for (sVar14 = 0; (bVar3 = pbVar10[sVar14], bVar3 != 0 && (bVar3 != 0x23)); sVar14 = sVar14 + 1)
    {
      bVar2 = is_query_character(this,(int)(char)bVar3);
      if (!bVar2) {
        return false;
      }
    }
    (this->query)._M_len = sVar14;
    (this->query)._M_str = (char *)pbVar10;
    bVar3 = pbVar10[sVar14];
    encoded = (char *)(pbVar10 + sVar14);
  }
  if (bVar3 == 0x23) {
    sVar14 = 0;
    while( true ) {
      bVar3 = ((byte *)encoded + 1)[sVar14];
      if (bVar3 == 0) {
        (this->fragment)._M_len = sVar14;
        (this->fragment)._M_str = (char *)((byte *)encoded + 1);
        return true;
      }
      bVar2 = is_query_character(this,(int)(char)bVar3);
      if (!bVar2) break;
      sVar14 = sVar14 + 1;
    }
    return false;
  }
  return true;
}

Assistant:

bool parse_from(const char *encoded) {
    const char *p = encoded;

    // IMPORTANT -- A uri may either be an absolute uri, or an
    // relative-reference Absolute: 'http://host.com' Relative-Reference:
    // '//:host.com', '/path1/path2?query', './path1:path2' A Relative-Reference
    // can be disambiguated by parsing for a ':' before the first slash

    bool is_relative_reference = true;
    const char *p2 = p;
    for (; *p2 != ('/') && *p2 != ('\0'); p2++) {
      if (*p2 == (':')) {
        // found a colon, the first portion is a scheme
        is_relative_reference = false;
        break;
      }
    }

    if (!is_relative_reference) {
      // the first character of a scheme must be a letter
      if (!isalpha(*p)) {
        return false;
      }

      // start parsing the scheme, it's always delimited by a colon (must be
      // present)
      auto scheme_begin = p++;
      for (; *p != ':'; p++) {
        if (!is_scheme_character(*p)) {
          return false;
        }
      }
      auto scheme_end = p;
      schema = std::string_view(scheme_begin, scheme_end - scheme_begin);
      is_ssl = (schema == "https" || schema == "wss");

      // skip over the colon
      p++;
    }

    // the uri must have http or https
    if (schema.empty()) {
      return false;
    }

    // if we see two slashes next, then we're going to parse the authority
    // portion later on we'll break up the authority into the port and host
    const char *authority_begin = nullptr;
    const char *authority_end = nullptr;
    if (*p == ('/') && p[1] == ('/')) {
      // skip over the slashes
      p += 2;
      authority_begin = p;

      // the authority is delimited by a slash (resource), question-mark (query)
      // or octothorpe (fragment) or by EOS. The authority could be empty
      // ('file:///C:\file_name.txt')
      for (; *p != ('/') && *p != ('?') && *p != ('#') && *p != ('\0'); p++) {
        // We're NOT currently supporting IPvFuture or username/password in
        // authority IPv6 as the host (i.e. http://[:::::::]) is allowed as
        // valid URI and passed to subsystem for support.
        if (!is_authority_character(*p)) {
          return false;
        }
      }
      authority_end = p;

      // now lets see if we have a port specified -- by working back from the
      // end
      if (authority_begin != authority_end) {
        // the port is made up of all digits
        const char *port_begin = authority_end - 1;
        for (; isdigit(*port_begin) && port_begin != authority_begin;
             port_begin--) {
        }

        const char *host_begin = nullptr;
        const char *host_end = nullptr;
        if (*port_begin == (':')) {
          // has a port
          host_begin = authority_begin;
          host_end = port_begin;

          // skip the colon
          port_begin++;

          port = std::string_view(port_begin, authority_end - port_begin);
        }
        else {
          // no port
          host_begin = authority_begin;
          host_end = authority_end;
        }

        // look for a user_info component
        const char *u_end = host_begin;
        for (; is_user_info_character(*u_end) && u_end != host_end; u_end++) {
        }

        if (*u_end == ('@')) {
          host_begin = u_end + 1;
          auto uinfo_begin = authority_begin;
          auto uinfo_end = u_end;
          uinfo = std::string_view(uinfo_begin, uinfo_end - uinfo_begin);
        }
        host = std::string_view(host_begin, host_end - host_begin);
      }
    }

    // if we see a path character or a slash, then the
    // if we see a slash, or any other legal path character, parse the path next
    if (*p == ('/') || is_path_character(*p)) {
      auto path_begin = p;

      // the path is delimited by a question-mark (query) or octothorpe
      // (fragment) or by EOS
      for (; *p != ('?') && *p != ('#') && *p != ('\0'); p++) {
        if (!is_path_character(*p)) {
          return false;
        }
      }
      auto path_end = p;
      path = std::string_view(path_begin, path_end - path_begin);
    }

    // if we see a ?, then the query is next
    if (*p == ('?')) {
      // skip over the question mark
      p++;
      auto query_begin = p;

      // the query is delimited by a '#' (fragment) or EOS
      for (; *p != ('#') && *p != ('\0'); p++) {
        if (!is_query_character(*p)) {
          return false;
        }
      }
      auto query_end = p;
      query = std::string_view(query_begin, query_end - query_begin);
    }

    // if we see a #, then the fragment is next
    if (*p == ('#')) {
      // skip over the hash mark
      p++;
      auto fragment_begin = p;

      // the fragment is delimited by EOS
      for (; *p != ('\0'); p++) {
        if (!is_fragment_character(*p)) {
          return false;
        }
      }
      auto fragment_end = p;
      fragment =
          std::string_view(fragment_begin, fragment_end - fragment_begin);
    }

    return true;
  }